

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

bool __thiscall
wallet::anon_unknown_5::WalletImpl::getPubKey
          (WalletImpl *this,CScript *script,CKeyID *address,CPubKey *pub_key)

{
  undefined1 uVar1;
  pointer *__ptr;
  long in_FS_OFFSET;
  WalletStorage local_28;
  Notifications local_20;
  
  local_20._vptr_Notifications = *(_func_int ***)(in_FS_OFFSET + 0x28);
  CWallet::GetSolvingProvider
            ((CWallet *)&stack0xffffffffffffffd8,
             (CScript *)
             (this->m_wallet).super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  if (local_28._vptr_WalletStorage == (_func_int **)0x0) {
    uVar1 = 0;
  }
  else {
    uVar1 = (**(code **)(*local_28._vptr_WalletStorage + 0x20))
                      (local_28._vptr_WalletStorage,address,pub_key);
    if (local_28._vptr_WalletStorage != (_func_int **)0x0) {
      (**(code **)(*local_28._vptr_WalletStorage + 8))();
    }
  }
  if (*(_func_int ***)(in_FS_OFFSET + 0x28) == local_20._vptr_Notifications) {
    return (bool)uVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool getPubKey(const CScript& script, const CKeyID& address, CPubKey& pub_key) override
    {
        std::unique_ptr<SigningProvider> provider = m_wallet->GetSolvingProvider(script);
        if (provider) {
            return provider->GetPubKey(address, pub_key);
        }
        return false;
    }